

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void __thiscall
libtorrent::dht::node::send_single_refresh(node *this,endpoint *ep,int bucket,node_id *id)

{
  uint *puVar1;
  bool bVar2;
  long lVar3;
  entry *peVar4;
  int c;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  shared_ptr<libtorrent::dht::ping_observer> o;
  entry e;
  shared_ptr<libtorrent::dht::traversal_algorithm> algo;
  node_id target;
  size_type __dnew;
  node_id mask;
  undefined1 local_f8 [16];
  undefined1 local_e8 [8];
  size_type sStack_e0;
  uint local_d8;
  size_type local_b8;
  __node_base _Stack_b0;
  undefined4 local_a8;
  string_type local_98;
  observer_ptr local_78;
  _Uninitialized<long,_true> local_68;
  routing_table *prStack_60;
  uint local_58;
  element_type *local_50;
  node_id local_44;
  
  generate_prefix_mask(&local_44,bucket + 1);
  generate_secret_id();
  local_b8 = 0;
  _Stack_b0._M_nxt = (_Hash_node_base *)0x0;
  local_a8 = 0;
  lVar3 = 0;
  do {
    *(uint *)((long)&local_b8 + lVar3) = ~*(uint *)((long)local_44.m_number._M_elems + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x14);
  local_58 = local_d8;
  local_68._M_storage = (long)local_e8;
  prStack_60 = (routing_table *)sStack_e0;
  lVar3 = 0;
  do {
    puVar1 = (uint *)((long)&local_68._M_storage + lVar3);
    *puVar1 = *puVar1 & *(uint *)((long)&local_b8 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x14);
  local_d8 = (this->m_id).m_number._M_elems[4];
  local_e8 = (undefined1  [8])*(size_type *)(this->m_id).m_number._M_elems;
  sStack_e0 = *(size_type *)((this->m_id).m_number._M_elems + 2);
  lVar3 = 0;
  do {
    *(uint *)(local_f8 + lVar3 + 0x10) =
         *(uint *)(local_f8 + lVar3 + 0x10) & *(uint *)((long)local_44.m_number._M_elems + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x14);
  lVar3 = 0;
  do {
    puVar1 = (uint *)((long)&local_68._M_storage + lVar3);
    *puVar1 = *puVar1 | *(uint *)(local_f8 + lVar3 + 0x10);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x14);
  local_e8 = (undefined1  [8])0x0;
  sStack_e0 = 0;
  local_d8 = 0;
  ::std::__shared_ptr<libtorrent::dht::traversal_algorithm,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<libtorrent::dht::traversal_algorithm>,libtorrent::dht::node&,libtorrent::digest32<160l>>
            ((__shared_ptr<libtorrent::dht::traversal_algorithm,(__gnu_cxx::_Lock_policy)2> *)
             &local_b8,(allocator<libtorrent::dht::traversal_algorithm> *)local_f8,this,
             (digest32<160L> *)(local_f8 + 0x10));
  rpc_manager::
  allocate_observer<libtorrent::dht::ping_observer,std::shared_ptr<libtorrent::dht::traversal_algorithm>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::digest32<160l>const&>
            ((rpc_manager *)local_f8,
             (shared_ptr<libtorrent::dht::traversal_algorithm> *)&this->m_rpc,
             (basic_endpoint<boost::asio::ip::udp> *)&local_b8,(digest32<160L> *)ep);
  if ((void *)local_f8._0_8_ != (void *)0x0) {
    entry::entry((entry *)(local_f8 + 0x10));
    key._M_str = "y";
    key._M_len = 1;
    peVar4 = entry::operator[]((entry *)(local_f8 + 0x10),key);
    entry::operator=(peVar4,"q");
    bVar2 = routing_table::is_full(&this->m_table,bucket);
    if (bVar2) {
      key_00._M_str = "q";
      key_00._M_len = 1;
      peVar4 = entry::operator[]((entry *)(local_f8 + 0x10),key_00);
      c = 0x90;
      entry::operator=(peVar4,"ping");
    }
    else {
      key_01._M_str = "q";
      key_01._M_len = 1;
      peVar4 = entry::operator[]((entry *)(local_f8 + 0x10),key_01);
      entry::operator=(peVar4,"get_peers");
      local_50 = (element_type *)0x14;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      local_98._M_dataplus._M_p =
           (pointer)::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_50);
      local_98.field_2._M_allocated_capacity = (size_type)local_50;
      *(uint *)((long)local_98._M_dataplus._M_p + 0x10) = local_58;
      *(long *)local_98._M_dataplus._M_p = local_68._M_storage;
      *(routing_table **)((long)local_98._M_dataplus._M_p + 8) = prStack_60;
      local_98._M_string_length = (size_type)local_50;
      *(undefined1 *)((long)local_98._M_dataplus._M_p + (long)local_50) = 0;
      key_02._M_str = "a";
      key_02._M_len = 1;
      peVar4 = entry::operator[]((entry *)(local_f8 + 0x10),key_02);
      key_03._M_str = "info_hash";
      key_03._M_len = 9;
      peVar4 = entry::operator[](peVar4,key_03);
      entry::operator=(peVar4,&local_98);
      c = 0x94;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,
                        (ulong)(local_98.field_2._M_allocated_capacity + 1));
      }
    }
    counters::inc_stats_counter(this->m_counters,c,1);
    *(byte *)(local_f8._0_8_ + 0x56) = *(byte *)(local_f8._0_8_ + 0x56) | 1;
    local_78.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_f8._0_8_;
    local_78.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_f8._8_8_ + 8) = *(_Atomic_word *)(local_f8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_f8._8_8_ + 8) = *(_Atomic_word *)(local_f8._8_8_ + 8) + 1;
      }
    }
    rpc_manager::invoke(&this->m_rpc,(entry *)(local_f8 + 0x10),ep,&local_78);
    if (local_78.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    entry::~entry((entry *)(local_f8 + 0x10));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_b0._M_nxt !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_b0._M_nxt);
  }
  return;
}

Assistant:

void node::send_single_refresh(udp::endpoint const& ep, int const bucket
	, node_id const& id)
{
	TORRENT_ASSERT(id != m_id);
	TORRENT_ASSERT(bucket >= 0);
	TORRENT_ASSERT(bucket <= 159);

	// generate a random node_id within the given bucket
	// TODO: 2 it would be nice to have a bias towards node-id prefixes that
	// are missing in the bucket
	node_id mask = generate_prefix_mask(bucket + 1);
	node_id target = generate_secret_id() & ~mask;
	target |= m_id & mask;

	// create a dummy traversal_algorithm
	auto algo = std::make_shared<traversal_algorithm>(*this, node_id());
	auto o = m_rpc.allocate_observer<ping_observer>(std::move(algo), ep, id);
	if (!o) return;
#if TORRENT_USE_ASSERTS
	o->m_in_constructor = false;
#endif
	entry e;
	e["y"] = "q";

	if (m_table.is_full(bucket))
	{
		// current bucket is full, just ping it.
		e["q"] = "ping";
		m_counters.inc_stats_counter(counters::dht_ping_out);
	}
	else
	{
		// use get_peers instead of find_node. We'll get nodes in the response
		// either way.
		e["q"] = "get_peers";
		e["a"]["info_hash"] = target.to_string();
		m_counters.inc_stats_counter(counters::dht_get_peers_out);
	}

	o->flags |= observer::flag_queried;
	m_rpc.invoke(e, ep, o);
}